

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::parseComment
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  int iVar4;
  long lVar5;
  string<unsigned_long> local_20;
  
  this->CurrentNodeType = EXN_COMMENT;
  puVar2 = this->P;
  iVar4 = 1;
  lVar5 = 0;
  while( true ) {
    puVar1 = (unsigned_long *)((long)puVar2 + lVar5 + 8);
    this->P = puVar1;
    if (iVar4 == 0) break;
    uVar3 = *puVar1;
    if (uVar3 == 0x3c) {
      iVar4 = iVar4 + 1;
    }
    else if (uVar3 == 0x3e) {
      iVar4 = iVar4 + -1;
    }
    lVar5 = lVar5 + 8;
  }
  this->P = (unsigned_long *)((long)puVar2 + lVar5 + -0x10);
  core::string<unsigned_long>::string<unsigned_long>
            (&local_20,puVar2 + 3,(int)(lVar5 - 0x18U >> 3) + -2);
  core::string<unsigned_long>::operator=(&this->NodeName,&local_20);
  core::string<unsigned_long>::~string(&local_20);
  this->P = this->P + 3;
  return;
}

Assistant:

void parseComment()
	{
		CurrentNodeType = EXN_COMMENT;
		P += 1;

		char_type *pCommentBegin = P;

		int count = 1;

		// move until end of comment reached
		while(count)
		{
			if (*P == L'>')
				--count;
			else
			if (*P == L'<')
				++count;

			++P;
		}

		P -= 3;
		NodeName = core::string<char_type>(pCommentBegin+2, (int)(P - pCommentBegin-2));
		P += 3;
	}